

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountAggregate.cpp
# Opt level: O1

void __thiscall CountAggregate::~CountAggregate(CountAggregate *this)

{
  vector<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
  *this_00;
  pointer pvVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer pdVar3;
  pointer pcVar4;
  pointer ppiVar5;
  ulong uVar6;
  ulong uVar7;
  
  (this->super_MachineLearningModel)._vptr_MachineLearningModel =
       (_func_int **)&PTR__CountAggregate_00144b70;
  if (dfdb::params::NUM_OF_FEATURES != 0) {
    uVar7 = 0;
    do {
      if (this->_features[uVar7] != (int *)0x0) {
        operator_delete__(this->_features[uVar7]);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < dfdb::params::NUM_OF_FEATURES);
  }
  if (this->_features != (int **)0x0) {
    operator_delete__(this->_features);
  }
  this_00 = &this->_aggregateRegister;
  if ((this->_aggregateRegister).
      super__Vector_base<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->_aggregateRegister).
      super__Vector_base<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar7 = 0;
    do {
      pvVar1 = (this_00->
               super__Vector_base<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      ppiVar5 = pvVar1[uVar7].super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar1[uVar7].super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                   super__Vector_impl_data + 8) != ppiVar5) {
        uVar6 = 0;
        do {
          if (ppiVar5[uVar6] != (int *)0x0) {
            operator_delete__(ppiVar5[uVar6]);
          }
          uVar6 = uVar6 + 1;
          pvVar1 = (this_00->
                   super__Vector_base<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          ppiVar5 = pvVar1[uVar7].super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar6 < (ulong)((long)*(pointer *)
                                        ((long)&pvVar1[uVar7].
                                                super__Vector_base<int_*,_std::allocator<int_*>_>.
                                                _M_impl.super__Vector_impl_data + 8) - (long)ppiVar5
                                >> 3));
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)(((long)(this->_aggregateRegister).
                                    super__Vector_base<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->_aggregateRegister).
                                    super__Vector_base<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
  }
  if (this->_numberOfAggregatesPerNode != (int *)0x0) {
    operator_delete__(this->_numberOfAggregatesPerNode);
  }
  if (this->_degreeOfLocalAggregates != (int *)0x0) {
    operator_delete__(this->_degreeOfLocalAggregates);
  }
  if (dfdb::params::NUM_OF_ATTRIBUTES != 0) {
    uVar7 = 0;
    do {
      if (uVar7 != (long)((this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->_root->_id) {
        if (this->aggPlaceholder[uVar7] != (int *)0x0) {
          operator_delete__(this->aggPlaceholder[uVar7]);
        }
        if (this->lineagePlaceholder[uVar7] != (int *)0x0) {
          operator_delete__(this->lineagePlaceholder[uVar7]);
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < dfdb::params::NUM_OF_ATTRIBUTES);
  }
  if (this->aggPlaceholder != (int **)0x0) {
    operator_delete__(this->aggPlaceholder);
  }
  if (this->lineagePlaceholder != (int **)0x0) {
    operator_delete__(this->lineagePlaceholder);
  }
  if (this->_cofactorMatrix != (ResultType *)0x0) {
    operator_delete__(this->_cofactorMatrix);
  }
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::~vector(&this->_lineageRegister);
  std::
  vector<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
  ::~vector(this_00);
  p_Var2 = (this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->_fade).super___shared_ptr<Fade,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  pdVar3 = (this->_fadeAggregates).categoricalAggregates.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pdVar3 != (pointer)0x0) {
    operator_delete(pdVar3);
  }
  p_Var2 = (this->_launcher).super___shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  pcVar4 = (this->_pathToFiles)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != &(this->_pathToFiles).field_2) {
    operator_delete(pcVar4);
    return;
  }
  return;
}

Assistant:

CountAggregate::~CountAggregate()
{
    for (size_t i = 0; i < NUM_OF_FEATURES; ++i)
        delete[] _features[i];
    delete[] _features;

    for (size_t i = 0; i < _aggregateRegister.size(); ++i)
        for (size_t j = 0; j < _aggregateRegister[i].size(); ++j)
            delete[] _aggregateRegister[i][j];

    delete[] _numberOfAggregatesPerNode;
    delete[] _degreeOfLocalAggregates;
    
    for (size_t i = 0; i < NUM_OF_ATTRIBUTES; ++i)
    {
        if (i != (size_t) _dTree->_root->_id)
        {
            delete[] aggPlaceholder[i];
            delete[] lineagePlaceholder[i];
        }
    }

    delete[] aggPlaceholder;
    delete[] lineagePlaceholder;
    delete[] _cofactorMatrix;
}